

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Setup(Compiler *this,ParseFlags flags,int64_t max_mem,Anchor anchor)

{
  ParseFlags PVar1;
  undefined4 in_ECX;
  ulong in_RDX;
  ParseFlags in_ESI;
  long in_RDI;
  int64_t m;
  undefined8 local_28;
  
  Prog::set_flags(*(Prog **)(in_RDI + 0x18),in_ESI);
  PVar1 = operator&(in_ESI,Latin1);
  if (PVar1 != NoParseFlags) {
    *(undefined4 *)(in_RDI + 0x24) = 2;
  }
  *(ulong *)(in_RDI + 0x48) = in_RDX;
  if ((long)in_RDX < 1) {
    *(undefined4 *)(in_RDI + 0x44) = 100000;
  }
  else if (in_RDX < 0x1a1) {
    *(undefined4 *)(in_RDI + 0x44) = 0;
  }
  else {
    local_28 = in_RDX - 0x1a0 >> 3;
    if (0xffffff < local_28) {
      local_28 = 0x1000000;
    }
    if (0xfffffff < local_28) {
      local_28 = 0xfffffff;
    }
    *(int *)(in_RDI + 0x44) = (int)local_28;
  }
  *(undefined4 *)(in_RDI + 0x90) = in_ECX;
  return;
}

Assistant:

void Compiler::Setup(Regexp::ParseFlags flags, int64_t max_mem,
                     RE2::Anchor anchor) {
  prog_->set_flags(flags);

  if (flags & Regexp::Latin1)
    encoding_ = kEncodingLatin1;
  max_mem_ = max_mem;
  if (max_mem <= 0) {
    max_ninst_ = 100000;  // more than enough
  } else if (static_cast<size_t>(max_mem) <= sizeof(Prog)) {
    // No room for anything.
    max_ninst_ = 0;
  } else {
    int64_t m = (max_mem - sizeof(Prog)) / sizeof(Prog::Inst);
    // Limit instruction count so that inst->id() fits nicely in an int.
    // SparseArray also assumes that the indices (inst->id()) are ints.
    // The call to WalkExponential uses 2*max_ninst_ below,
    // and other places in the code use 2 or 3 * prog->size().
    // Limiting to 2^24 should avoid overflow in those places.
    // (The point of allowing more than 32 bits of memory is to
    // have plenty of room for the DFA states, not to use it up
    // on the program.)
    if (m >= 1<<24)
      m = 1<<24;

    // Inst imposes its own limit (currently bigger than 2^24 but be safe).
    if (m > Prog::Inst::kMaxInst)
      m = Prog::Inst::kMaxInst;

    max_ninst_ = static_cast<int>(m);
  }

  anchor_ = anchor;
}